

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

bool __thiscall pbrt::Triangle::IntersectP(Triangle *this,Ray *ray,Float tMax)

{
  Point3f *pPVar1;
  long in_RDI;
  long *in_FS_OFFSET;
  optional<pbrt::TriangleIntersection> isect;
  Point3f p2;
  Point3f p1;
  Point3f p0;
  int *v;
  TriangleMesh *mesh;
  Point3f *in_stack_000003a8;
  Point3f *in_stack_000003b0;
  Point3f *in_stack_000003b8;
  Float in_stack_000003c4;
  Ray *in_stack_000003c8;
  optional local_74 [20];
  undefined8 local_60;
  float local_58;
  undefined8 local_50;
  float local_48;
  undefined8 local_40;
  float local_38;
  int *local_30;
  TriangleMesh *local_28;
  byte local_1;
  
  in_FS_OFFSET[-0x92] = in_FS_OFFSET[-0x92] + 1;
  local_28 = GetMesh((Triangle *)0x45df67);
  local_30 = local_28->vertexIndices + *(int *)(in_RDI + 4) * 3;
  local_38 = local_28->p[*local_30].super_Tuple3<pbrt::Point3,_float>.z;
  pPVar1 = local_28->p + *local_30;
  local_40._0_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
  local_40._4_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
  local_48 = local_28->p[local_30[1]].super_Tuple3<pbrt::Point3,_float>.z;
  pPVar1 = local_28->p + local_30[1];
  local_50._0_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
  local_50._4_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
  local_58 = local_28->p[local_30[2]].super_Tuple3<pbrt::Point3,_float>.z;
  pPVar1 = local_28->p + local_30[2];
  local_60._0_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
  local_60._4_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
  IntersectTriangle(in_stack_000003c8,in_stack_000003c4,in_stack_000003b8,in_stack_000003b0,
                    in_stack_000003a8);
  local_1 = pstd::optional::operator_cast_to_bool(local_74);
  if ((bool)local_1) {
    *(long *)(*in_FS_OFFSET + -0x488) = *(long *)(*in_FS_OFFSET + -0x488) + 1;
  }
  pstd::optional<pbrt::TriangleIntersection>::~optional
            ((optional<pbrt::TriangleIntersection> *)0x45e0ba);
  return (bool)(local_1 & 1);
}

Assistant:

bool Triangle::IntersectP(const Ray &ray, Float tMax) const {
#ifndef PBRT_IS_GPU_CODE
    ++nTriTests;
#endif
    // Get triangle vertices in _p0_, _p1_, and _p2_
    const TriangleMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[3 * triIndex];
    Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

    pstd::optional<TriangleIntersection> isect = IntersectTriangle(ray, tMax, p0, p1, p2);
    if (isect) {
#ifndef PBRT_IS_GPU_CODE
        ++nTriHits;
#endif
        return true;
    } else
        return false;
}